

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

float tcu::computeBilinearSearchStepFromFloatQuad(LookupPrecision *prec,ColorQuad *quad)

{
  float fVar1;
  float step;
  undefined1 local_ec [8];
  Vec4 minStep;
  Vec4 stepCount;
  Vector<float,_4> local_bc;
  undefined1 local_ac [8];
  Vec4 maxD;
  undefined1 local_8c [8];
  Vec4 d3;
  undefined1 local_6c [8];
  Vec4 d2;
  undefined1 local_4c [8];
  Vec4 d1;
  undefined1 local_2c [8];
  Vec4 d0;
  int maxSteps;
  ColorQuad *quad_local;
  LookupPrecision *prec_local;
  
  d0.m_data[2] = 9.18355e-41;
  unique0x100003b8 = quad;
  operator-((tcu *)(d1.m_data + 2),&quad->p10,&quad->p00);
  abs<float,4>((tcu *)local_2c,(Vector<float,_4> *)(d1.m_data + 2));
  operator-((tcu *)(d2.m_data + 2),&stack0xffffffffffffffe8->p01,&stack0xffffffffffffffe8->p00);
  abs<float,4>((tcu *)local_4c,(Vector<float,_4> *)(d2.m_data + 2));
  operator-((tcu *)(d3.m_data + 2),&stack0xffffffffffffffe8->p11,&stack0xffffffffffffffe8->p10);
  abs<float,4>((tcu *)local_6c,(Vector<float,_4> *)(d3.m_data + 2));
  operator-((tcu *)(maxD.m_data + 2),&stack0xffffffffffffffe8->p11,&stack0xffffffffffffffe8->p01);
  abs<float,4>((tcu *)local_8c,(Vector<float,_4> *)(maxD.m_data + 2));
  max<float,4>((tcu *)(stepCount.m_data + 2),(Vector<float,_4> *)local_6c,
               (Vector<float,_4> *)local_8c);
  max<float,4>((tcu *)&local_bc,(Vector<float,_4> *)local_4c,
               (Vector<float,_4> *)(stepCount.m_data + 2));
  max<float,4>((tcu *)local_ac,(Vector<float,_4> *)local_2c,&local_bc);
  operator/((tcu *)(minStep.m_data + 2),(Vector<float,_4> *)local_ac,&prec->colorThreshold);
  operator+((tcu *)&stack0xffffffffffffff04,(Vector<float,_4> *)(minStep.m_data + 2),1.0);
  operator/((tcu *)local_ec,1.0,(Vector<float,_4> *)&stack0xffffffffffffff04);
  fVar1 = minComp<float,4>((Vector<float,_4> *)local_ec);
  fVar1 = de::max<float>(fVar1,1.5258789e-05);
  return fVar1;
}

Assistant:

static float computeBilinearSearchStepFromFloatQuad (const LookupPrecision&	prec,
													 const ColorQuad&		quad)
{
	DE_ASSERT(boolAll(greaterThan(prec.colorThreshold, Vec4(0.0f))));

	const int		maxSteps	= 1<<16;
	const Vec4		d0			= abs(quad.p10 - quad.p00);
	const Vec4		d1			= abs(quad.p01 - quad.p00);
	const Vec4		d2			= abs(quad.p11 - quad.p10);
	const Vec4		d3			= abs(quad.p11 - quad.p01);
	const Vec4		maxD		= max(d0, max(d1, max(d2, d3)));
	const Vec4		stepCount	= maxD / prec.colorThreshold;
	const Vec4		minStep		= 1.0f / (stepCount + 1.0f);
	const float		step		= de::max(minComp(minStep), 1.0f / float(maxSteps));

	return step;
}